

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O2

int pt_blk_next(pt_block_decoder *decoder,pt_block *ublock,size_t size)

{
  int iVar1;
  int iVar2;
  pt_block *ppVar3;
  pt_block *block_00;
  pt_block block;
  
  if (ublock == (pt_block *)0x0 || decoder == (pt_block_decoder *)0x0) {
    iVar1 = -2;
  }
  else {
    block_00 = &block;
    if (size == 0x30) {
      block_00 = ublock;
    }
    block_00->raw[2] = '\0';
    block_00->raw[3] = '\0';
    block_00->raw[4] = '\0';
    block_00->raw[5] = '\0';
    block_00->raw[6] = '\0';
    block_00->raw[7] = '\0';
    block_00->raw[8] = '\0';
    block_00->raw[9] = '\0';
    *(undefined8 *)(block_00->raw + 10) = 0;
    block_00->isid = 0;
    block_00->mode = ptem_unknown;
    block_00->iclass = ptic_error;
    block_00->ninsn = 0;
    block_00->raw[0] = '\0';
    block_00->raw[1] = '\0';
    block_00->ip = 0;
    block_00->end_ip = 0;
    block_00->ip = decoder->ip;
    block_00->mode = decoder->mode;
    if ((decoder->field_0xa74 & 2) != 0) {
      ppVar3 = &block;
      if (size == 0x30) {
        ppVar3 = ublock;
      }
      ppVar3->field_0x2e = ppVar3->field_0x2e | 1;
    }
    iVar1 = decoder->status;
    if (iVar1 < 0) {
      if (iVar1 == -7) {
        if ((decoder->field_0xa74 & 1) == 0) {
          iVar1 = -7;
        }
        else {
          iVar2 = pt_blk_proceed_no_event(decoder,block_00);
          iVar1 = 4;
          if (iVar2 < 0) {
            iVar1 = iVar2;
          }
        }
      }
    }
    else if (((decoder->event).type & ~ptev_disabled) == ptev_tip) {
      if ((decoder->field_0xa74 & 1) == 0) {
        iVar1 = -0x17;
      }
      else {
        iVar1 = pt_blk_proceed_no_event(decoder,block_00);
        if (-1 < iVar1) {
          iVar1 = pt_blk_proceed_trailing_event(decoder,block_00);
        }
      }
    }
    else {
      iVar1 = pt_blk_proceed_event(decoder,block_00);
    }
    if (block_00 != ublock) {
      if (0x30 < size) {
        memset(ublock + 1,0,size - 0x30);
        size = 0x30;
      }
      memcpy(ublock,block_00,size);
    }
  }
  return iVar1;
}

Assistant:

int pt_blk_next(struct pt_block_decoder *decoder, struct pt_block *ublock,
		size_t size)
{
	struct pt_block block, *pblock;
	int errcode, status;

	if (!decoder || !ublock)
		return -pte_invalid;

	pblock = size == sizeof(block) ? ublock : &block;

	/* Zero-initialize the block in case of error returns. */
	memset(pblock, 0, sizeof(*pblock));

	/* Fill in a few things from the current decode state.
	 *
	 * This reflects the state of the last pt_blk_next() or pt_blk_start()
	 * call.  Note that, unless we stop with tracing disabled, we proceed
	 * already to the start IP of the next block.
	 *
	 * Some of the state may later be overwritten as we process events.
	 */
	pblock->ip = decoder->ip;
	pblock->mode = decoder->mode;
	if (decoder->speculative)
		pblock->speculative = 1;

	/* Proceed one block. */
	status = pt_blk_proceed(decoder, pblock);

	errcode = block_to_user(ublock, size, pblock);
	if (errcode < 0)
		return errcode;

	return status;
}